

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O2

void xml_print_attrs(lyout *out,lyd_node *node,int options)

{
  byte bVar1;
  lyd_attr *plVar2;
  char *__s2;
  int iVar3;
  lys_node *plVar4;
  lys_module *plVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 in_RCX;
  ulong uVar8;
  char *pcVar9;
  lyd_attr **pplVar10;
  char **local_58;
  char **prefs;
  char **local_48;
  char **nss;
  uint local_34 [2];
  uint32_t ns_count;
  
  plVar4 = node->schema;
  if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
    bVar1 = node->field_0x9;
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
    if (((options & 0xc0U) != 0 & bVar1) == 0) {
      if (((options & 0x40U) == 0 || (bVar1 & 1) != 0) ||
         (iVar3 = lyd_wd_default((lyd_node_leaf_list *)node), iVar3 == 0)) goto LAB_00177500;
      plVar4 = node->schema;
    }
    plVar5 = ly_ctx_get_module(plVar4->module->ctx,"ietf-netconf-with-defaults",(char *)0x0);
    if (plVar5 != (lys_module *)0x0) {
      ly_print(out," %s:default=\"true\"",plVar5->prefix);
    }
  }
LAB_00177500:
  plVar4 = node->schema;
  iVar3 = strcmp(plVar4->name,"filter");
  prefs._4_4_ = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (iVar3 == 0) {
    pcVar6 = plVar4->module->name;
    iVar3 = strcmp(pcVar6,"ietf-netconf");
    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"notifications"), iVar3 == 0)) {
      prefs._4_4_ = 0;
    }
  }
  pplVar10 = &node->attr;
  pcVar6 = (char *)0x0;
  nss = (char **)node;
  do {
    plVar2 = *pplVar10;
    if (plVar2 == (lyd_attr *)0x0) {
      return;
    }
    if (prefs._4_1_ == '\0') {
      pcVar9 = plVar2->name;
      iVar3 = strcmp(pcVar9,"select");
      if (iVar3 == 0) {
        pcVar6 = transform_json2xml(*(lys_module **)(*nss + 0x30),plVar2->value_str,&local_58,
                                    &local_48,local_34);
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "\"(!error!)\"";
          goto LAB_001777c4;
        }
        for (uVar8 = 0; uVar8 < local_34[0]; uVar8 = uVar8 + 1) {
          ly_print(out," xmlns:%s=\"%s\"",local_58[uVar8],local_48[uVar8]);
        }
        free(local_58);
        free(local_48);
        pcVar9 = plVar2->name;
      }
      ly_print(out," %s=\"",pcVar9);
      node = (lyd_node *)nss;
    }
    else {
      ly_print(out," %s:%s=\"",plVar2->annotation->module->prefix,plVar2->name);
    }
    switch(plVar2->value_type & 0x3f) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 6:
    case 10:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
      if (plVar2->value_str != (char *)0x0) {
        pcVar7 = plVar2->value_str;
        if (pcVar6 != (char *)0x0) {
          pcVar7 = pcVar6;
        }
LAB_00177665:
        lyxml_dump_text(out,pcVar7);
      }
      break;
    case 5:
      break;
    case 7:
      pcVar9 = plVar2->value_str;
      node = (lyd_node *)nss;
      if (pcVar9 != (char *)0x0) {
        pcVar7 = strchr(pcVar9,0x3a);
        if (pcVar7 == (char *)0x0) {
          __assert_fail("p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                        ,0xd4,"void xml_print_attrs(struct lyout *, const struct lyd_node *, int)");
        }
        __s2 = plVar2->annotation->module->name;
        iVar3 = strncmp(pcVar9,__s2,(long)pcVar7 - (long)pcVar9);
        node = (lyd_node *)nss;
        if ((iVar3 == 0) && (__s2[(long)pcVar7 - (long)pcVar9] == '\0')) {
          pcVar7 = pcVar7 + 1;
          goto LAB_00177665;
        }
        goto switchD_00177653_caseD_8;
      }
      break;
    case 8:
switchD_00177653_caseD_8:
      pcVar6 = transform_json2xml(node->schema->module,(char *)node->child,&local_58,&local_48,
                                  local_34);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "(!error!)";
LAB_001777c4:
        ly_print(out,pcVar6);
        return;
      }
      for (uVar8 = 0; uVar8 < local_34[0]; uVar8 = uVar8 + 1) {
        ly_print(out," xmlns:%s=\"%s\"",local_58[uVar8],local_48[uVar8]);
      }
      free(local_58);
      free(local_48);
      lyxml_dump_text(out,pcVar6);
      node = (lyd_node *)nss;
      lydict_remove((ly_ctx *)**(undefined8 **)(*nss + 0x30),pcVar6);
      break;
    default:
      ly_print(out,"(!error!)");
    }
    ly_print(out,"\"");
    if (pcVar6 != (char *)0x0) {
      lydict_remove(node->schema->module->ctx,pcVar6);
    }
    pplVar10 = &plVar2->next;
  } while( true );
}

Assistant:

static void
xml_print_attrs(struct lyout *out, const struct lyd_node *node, int options)
{
    struct lyd_attr *attr;
    const char **prefs, **nss;
    const char *xml_expr = NULL, *mod_name;
    uint32_t ns_count, i;
    int rpc_filter = 0;
    const struct lys_module *wdmod = NULL;
    char *p;
    size_t len;

    /* with-defaults */
    if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        if ((node->dflt && (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG))) ||
                (!node->dflt && (options & LYP_WD_ALL_TAG) && lyd_wd_default((struct lyd_node_leaf_list *)node))) {
            /* we have implicit OR explicit default node */
            /* get with-defaults module */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL);
            if (wdmod) {
                /* print attribute only if context include with-defaults schema */
                ly_print(out, " %s:default=\"true\"", wdmod->prefix);
            }
        }
    }
    /* technically, check for the extension get-filter-element-attributes from ietf-netconf */
    if (!strcmp(node->schema->name, "filter")
            && (!strcmp(node->schema->module->name, "ietf-netconf") || !strcmp(node->schema->module->name, "notifications"))) {
        rpc_filter = 1;
    }

    for (attr = node->attr; attr; attr = attr->next) {
        if (rpc_filter) {
            /* exception for NETCONF's filter's attributes */
            if (!strcmp(attr->name, "select")) {
                /* xpath content, we have to convert the JSON format into XML first */
                xml_expr = transform_json2xml(node->schema->module, attr->value_str, &prefs, &nss, &ns_count);
                if (!xml_expr) {
                    /* error */
                    ly_print(out, "\"(!error!)\"");
                    return;
                }

                for (i = 0; i < ns_count; ++i) {
                    ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
                }
                free(prefs);
                free(nss);
            }
            ly_print(out, " %s=\"", attr->name);
        } else {
            ly_print(out, " %s:%s=\"", attr->annotation->module->prefix, attr->name);
        }

        switch (attr->value_type & LY_DATA_TYPE_MASK) {
        case LY_TYPE_BINARY:
        case LY_TYPE_STRING:
        case LY_TYPE_BITS:
        case LY_TYPE_ENUM:
        case LY_TYPE_BOOL:
        case LY_TYPE_DEC64:
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (attr->value_str) {
                /* xml_expr can contain transformed xpath */
                lyxml_dump_text(out, xml_expr ? xml_expr : attr->value_str);
            }
            break;

        case LY_TYPE_IDENT:
            if (!attr->value_str) {
                break;
            }
            p = strchr(attr->value_str, ':');
            assert(p);
            len = p - attr->value_str;
            mod_name = attr->annotation->module->name;
            if (!strncmp(attr->value_str, mod_name, len) && !mod_name[len]) {
                lyxml_dump_text(out, ++p);
            } else {
                /* avoid code duplication - use instance-identifier printer which gets necessary namespaces to print */
                goto printinst;
            }
            break;
        case LY_TYPE_INST:
printinst:
            xml_expr = transform_json2xml(node->schema->module, ((struct lyd_node_leaf_list *)node)->value_str,
                                          &prefs, &nss, &ns_count);
            if (!xml_expr) {
                /* error */
                ly_print(out, "(!error!)");
                return;
            }

            for (i = 0; i < ns_count; ++i) {
                ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
            }
            free(prefs);
            free(nss);

            lyxml_dump_text(out, xml_expr);
            lydict_remove(node->schema->module->ctx, xml_expr);
            break;

        /* LY_TYPE_LEAFREF not allowed */
        case LY_TYPE_EMPTY:
            break;

        default:
            /* error */
            ly_print(out, "(!error!)");
        }

        ly_print(out, "\"");

        if (xml_expr) {
            lydict_remove(node->schema->module->ctx, xml_expr);
        }
    }
}